

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktUniformBlockTests.cpp
# Opt level: O3

void __thiscall
vkt::ubo::anon_unknown_0::BlockMultiBasicTypesCase::BlockMultiBasicTypesCase
          (BlockMultiBasicTypesCase *this,TestContext *testCtx,string *name,string *description,
          deUint32 flagsA,deUint32 flagsB,BufferMode bufferMode,int numInstances,
          MatrixLoadFlags matrixLoadFlag)

{
  ShaderInterface *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  UniformBlock *pUVar3;
  UniformBlock *pUVar4;
  vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_> *pvVar5;
  string local_b8;
  VarType local_98;
  Uniform local_80;
  deUint32 local_40;
  deUint32 local_3c;
  BlockMultiBasicTypesCase *local_38;
  
  local_40 = flagsB;
  UniformBlockCase::UniformBlockCase
            (&this->super_UniformBlockCase,testCtx,name,description,bufferMode,matrixLoadFlag,false)
  ;
  (this->super_UniformBlockCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__UniformBlockCase_00d2f8b0;
  paVar1 = &local_80.m_name.field_2;
  local_80.m_name._M_dataplus._M_p = (pointer)paVar1;
  local_38 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"BlockA","");
  this_00 = &(this->super_UniformBlockCase).m_interface;
  pUVar3 = ShaderInterface::allocBlock(this_00,&local_80.m_name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_80.m_name._M_dataplus._M_p,
                    local_80.m_name.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_b8.field_2;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"a","");
  VarType::VarType(&local_98,TYPE_FLOAT,4);
  Uniform::Uniform(&local_80,&local_b8,&local_98,0);
  pvVar5 = &pUVar3->m_uniforms;
  local_3c = flagsA;
  std::vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>::push_back(pvVar5,&local_80);
  VarType::~VarType(&local_80.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_80.m_name._M_dataplus._M_p,
                    local_80.m_name.field_2._M_allocated_capacity + 1);
  }
  VarType::~VarType(&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"b","");
  VarType::VarType(&local_98,TYPE_UINT_VEC3,1);
  Uniform::Uniform(&local_80,&local_b8,&local_98,0x1800);
  std::vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>::push_back(pvVar5,&local_80);
  VarType::~VarType(&local_80.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_80.m_name._M_dataplus._M_p,
                    local_80.m_name.field_2._M_allocated_capacity + 1);
  }
  VarType::~VarType(&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"c","");
  VarType::VarType(&local_98,TYPE_FLOAT_MAT2,2);
  Uniform::Uniform(&local_80,&local_b8,&local_98,0);
  std::vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>::push_back(pvVar5,&local_80);
  VarType::~VarType(&local_80.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_80.m_name._M_dataplus._M_p,
                    local_80.m_name.field_2._M_allocated_capacity + 1);
  }
  VarType::~VarType(&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_80.m_name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"blockA","");
  std::__cxx11::string::_M_assign((string *)&pUVar3->m_instanceName);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_80.m_name._M_dataplus._M_p,
                    local_80.m_name.field_2._M_allocated_capacity + 1);
  }
  pUVar3->m_flags = local_3c;
  local_80.m_name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"BlockB","");
  pUVar4 = ShaderInterface::allocBlock(this_00,&local_80.m_name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_80.m_name._M_dataplus._M_p,
                    local_80.m_name.field_2._M_allocated_capacity + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"a","");
  VarType::VarType(&local_98,TYPE_FLOAT_MAT3,2);
  Uniform::Uniform(&local_80,&local_b8,&local_98,0);
  pvVar5 = &pUVar4->m_uniforms;
  std::vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>::push_back(pvVar5,&local_80);
  VarType::~VarType(&local_80.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_80.m_name._M_dataplus._M_p,
                    local_80.m_name.field_2._M_allocated_capacity + 1);
  }
  VarType::~VarType(&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"b","");
  VarType::VarType(&local_98,TYPE_INT_VEC2,1);
  Uniform::Uniform(&local_80,&local_b8,&local_98,0);
  std::vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>::push_back(pvVar5,&local_80);
  VarType::~VarType(&local_80.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_80.m_name._M_dataplus._M_p,
                    local_80.m_name.field_2._M_allocated_capacity + 1);
  }
  VarType::~VarType(&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"c","");
  VarType::VarType(&local_98,TYPE_FLOAT_VEC4,4);
  Uniform::Uniform(&local_80,&local_b8,&local_98,0x1800);
  std::vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>::push_back(pvVar5,&local_80);
  VarType::~VarType(&local_80.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_80.m_name._M_dataplus._M_p,
                    local_80.m_name.field_2._M_allocated_capacity + 1);
  }
  VarType::~VarType(&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"d","");
  VarType::VarType(&local_98,TYPE_BOOL,0);
  Uniform::Uniform(&local_80,&local_b8,&local_98,0);
  std::vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>::push_back(pvVar5,&local_80);
  VarType::~VarType(&local_80.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_80.m_name._M_dataplus._M_p,
                    local_80.m_name.field_2._M_allocated_capacity + 1);
  }
  VarType::~VarType(&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_80.m_name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"blockB","");
  std::__cxx11::string::_M_assign((string *)&pUVar4->m_instanceName);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_80.m_name._M_dataplus._M_p,
                    local_80.m_name.field_2._M_allocated_capacity + 1);
  }
  pUVar4->m_flags = local_40;
  if (0 < numInstances) {
    pUVar3->m_arraySize = numInstances;
    pUVar4->m_arraySize = numInstances;
  }
  (*(local_38->super_UniformBlockCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [2])();
  return;
}

Assistant:

BlockMultiBasicTypesCase (tcu::TestContext& testCtx, const std::string& name, const std::string& description, deUint32 flagsA, deUint32 flagsB, BufferMode bufferMode, int numInstances, MatrixLoadFlags matrixLoadFlag)
		: UniformBlockCase	(testCtx, name, description, bufferMode, matrixLoadFlag)
	{
		UniformBlock& blockA = m_interface.allocBlock("BlockA");
		blockA.addUniform(Uniform("a", VarType(glu::TYPE_FLOAT, PRECISION_HIGH)));
		blockA.addUniform(Uniform("b", VarType(glu::TYPE_UINT_VEC3, PRECISION_LOW), UNUSED_BOTH));
		blockA.addUniform(Uniform("c", VarType(glu::TYPE_FLOAT_MAT2, PRECISION_MEDIUM)));
		blockA.setInstanceName("blockA");
		blockA.setFlags(flagsA);

		UniformBlock& blockB = m_interface.allocBlock("BlockB");
		blockB.addUniform(Uniform("a", VarType(glu::TYPE_FLOAT_MAT3, PRECISION_MEDIUM)));
		blockB.addUniform(Uniform("b", VarType(glu::TYPE_INT_VEC2, PRECISION_LOW)));
		blockB.addUniform(Uniform("c", VarType(glu::TYPE_FLOAT_VEC4, PRECISION_HIGH), UNUSED_BOTH));
		blockB.addUniform(Uniform("d", VarType(glu::TYPE_BOOL, 0)));
		blockB.setInstanceName("blockB");
		blockB.setFlags(flagsB);

		if (numInstances > 0)
		{
			blockA.setArraySize(numInstances);
			blockB.setArraySize(numInstances);
		}

		init();
	}